

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O1

void __thiscall
soplex::SPxLPBase<double>::computePrimalActivity
          (SPxLPBase<double> *this,VectorBase<double> *primal,VectorBase<double> *activity,
          bool unscaled)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  double *pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  Nonzero<double> *pNVar7;
  undefined4 uVar8;
  undefined8 *puVar9;
  uint uVar10;
  undefined7 in_register_00000009;
  ulong uVar11;
  long lVar12;
  long lVar13;
  Item *pIVar14;
  int *piVar15;
  iterator __end0;
  ulong uVar16;
  vector<double,_std::allocator<double>_> *__range2;
  bool bVar17;
  DSVectorBase<double> tmp;
  undefined **local_60;
  Nonzero<double> *local_58;
  undefined8 uStack_50;
  Nonzero<double> *local_48;
  undefined4 local_3c;
  ulong local_38;
  
  pdVar4 = (primal->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar10 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  if (uVar10 != (uint)((ulong)((long)(primal->val).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)pdVar4) >> 3)) {
    puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_60 = (undefined **)&uStack_50;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,
               "XSPXLP01 Primal vector for computing row activity has wrong dimension","");
    *puVar9 = &PTR__SPxException_006a9ee8;
    puVar9[1] = puVar9 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar9 + 1),local_60,(long)local_58 + (long)local_60);
    *puVar9 = &PTR__SPxException_006a9ec0;
    __cxa_throw(puVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  }
  pdVar5 = (activity->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (activity->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar11 = (long)pdVar6 - (long)pdVar5;
  uVar2 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  if (uVar2 != (uint)(uVar11 >> 3)) {
    puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_60 = (undefined **)&uStack_50;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,
               "XSPXLP03 Activity vector computing row activity has wrong dimension","");
    *puVar9 = &PTR__SPxException_006a9ee8;
    puVar9[1] = puVar9 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar9 + 1),local_60,(long)local_58 + (long)local_60);
    *puVar9 = &PTR__SPxException_006a9ec0;
    __cxa_throw(puVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  }
  bVar17 = 0 < (int)uVar10;
  if (0 < (int)uVar10) {
    uVar16 = 1;
    if ((*pdVar4 != 0.0) || (NAN(*pdVar4))) {
      local_38 = 0;
    }
    else {
      do {
        local_38 = uVar16;
        if (uVar10 == local_38) goto LAB_001b2e6d;
        uVar16 = local_38 + 1;
      } while ((pdVar4[local_38] == 0.0) && (!NAN(pdVar4[local_38])));
      bVar17 = local_38 < uVar10;
    }
    if (bVar17) {
      local_58 = (Nonzero<double> *)0x0;
      uStack_50 = (undefined *)0x0;
      local_60 = &PTR__DSVectorBase_006aae80;
      local_48 = (Nonzero<double> *)0x0;
      local_3c = (undefined4)CONCAT71(in_register_00000009,unscaled);
      uVar10 = 2;
      if (0 < (int)uVar2) {
        uVar10 = uVar2;
      }
      spx_alloc<soplex::Nonzero<double>*>(&local_48,uVar10);
      local_58 = local_48;
      uStack_50 = (undefined *)(ulong)uVar10;
      if (((char)local_3c == '\0') || (this->_isScaled != true)) {
        pIVar14 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
                  (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey
                  [local_38 & 0xffffffff].idx;
        pdVar5 = (activity->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (activity->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pdVar5 != pdVar6) {
          memset(pdVar5,0,(long)pdVar6 - (long)pdVar5 & 0xfffffffffffffff8);
        }
        lVar12 = (long)(pIVar14->data).super_SVectorBase<double>.memused;
        if (0 < lVar12) {
          pNVar7 = (pIVar14->data).super_SVectorBase<double>.m_elem;
          lVar13 = 0;
          do {
            pdVar5[*(int *)((long)&pNVar7->idx + lVar13)] = *(double *)((long)&pNVar7->val + lVar13)
            ;
            lVar13 = lVar13 + 0x10;
          } while (lVar12 * 0x10 != lVar13);
        }
      }
      else {
        (*this->lp_scaler->_vptr_SPxScaler[0x11])(this->lp_scaler,this,local_38,&local_60);
        pdVar5 = (activity->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (activity->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (pdVar5 != pdVar6) {
          memset(pdVar5,0,(long)pdVar6 - (long)pdVar5 & 0xfffffffffffffff8);
        }
        if (0 < (long)uStack_50._4_4_) {
          lVar12 = 0;
          do {
            pdVar5[*(int *)((long)&local_58->idx + lVar12)] =
                 *(double *)((long)&local_58->val + lVar12);
            lVar12 = lVar12 + 0x10;
          } while ((long)uStack_50._4_4_ * 0x10 != lVar12);
        }
      }
      uVar8 = local_3c;
      pdVar5 = (activity->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = (uint)((ulong)((long)(activity->val).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pdVar5) >> 3);
      if (0 < (int)uVar10) {
        pdVar6 = (primal->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar11 = 0;
        do {
          pdVar5[uVar11] = pdVar6[local_38 & 0xffffffff] * pdVar5[uVar11];
          uVar11 = uVar11 + 1;
        } while ((uVar10 & 0x7fffffff) != uVar11);
      }
      if ((int)local_38 + 1 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum)
      {
        do {
          pdVar5 = (primal->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar1 = pdVar5[uVar16];
          if ((dVar1 != 0.0) || (NAN(dVar1))) {
            if (((char)uVar8 == '\0') || (this->_isScaled != true)) {
              pIVar14 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem;
              iVar3 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[uVar16].
                      idx;
              lVar12 = (long)pIVar14[iVar3].data.super_SVectorBase<double>.memused;
              if (0 < lVar12) {
                pdVar6 = (activity->val).super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start;
                lVar13 = lVar12 + 1;
                piVar15 = &pIVar14[iVar3].data.super_SVectorBase<double>.m_elem[lVar12 + -1].idx;
                do {
                  pdVar6[*piVar15] =
                       pdVar5[uVar16] * ((Nonzero<double> *)(piVar15 + -2))->val + pdVar6[*piVar15];
                  lVar13 = lVar13 + -1;
                  piVar15 = piVar15 + -4;
                } while (1 < lVar13);
              }
            }
            else {
              (*this->lp_scaler->_vptr_SPxScaler[0x11])
                        (this->lp_scaler,this,uVar16 & 0xffffffff,&local_60);
              lVar12 = (long)uStack_50._4_4_;
              if (0 < lVar12) {
                pdVar5 = (primal->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                pdVar6 = (activity->val).super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start;
                lVar13 = lVar12 + 1;
                piVar15 = &local_58[lVar12 + -1].idx;
                do {
                  pdVar6[*piVar15] =
                       pdVar5[uVar16] * ((Nonzero<double> *)(piVar15 + -2))->val + pdVar6[*piVar15];
                  lVar13 = lVar13 + -1;
                  piVar15 = piVar15 + -4;
                } while (1 < lVar13);
              }
            }
          }
          uVar16 = uVar16 + 1;
        } while ((int)uVar16 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum
                );
      }
      local_60 = &PTR__DSVectorBase_006aae80;
      if (local_48 == (Nonzero<double> *)0x0) {
        return;
      }
      free(local_48);
      return;
    }
  }
LAB_001b2e6d:
  if (pdVar5 == pdVar6) {
    return;
  }
  memset(pdVar5,0,(uVar11 - 8 & 0xfffffffffffffff8) + 8);
  return;
}

Assistant:

inline
void SPxLPBase<R>::computePrimalActivity(const VectorBase<R>& primal, VectorBase<R>& activity,
      const bool unscaled) const
{
   if(primal.dim() != nCols())
      throw SPxInternalCodeException("XSPXLP01 Primal vector for computing row activity has wrong dimension");

   if(activity.dim() != nRows())
      throw SPxInternalCodeException("XSPXLP03 Activity vector computing row activity has wrong dimension");

   int c;

   for(c = 0; c < nCols() && primal[c] == 0; c++)
      ;

   if(c >= nCols())
   {
      activity.clear();
      return;
   }

   DSVectorBase<R> tmp(nRows());

   if(unscaled && _isScaled)
   {
      lp_scaler->getColUnscaled(*this, c, tmp);
      activity = tmp;
   }
   else
      activity = colVector(c);

   activity *= primal[c];
   c++;

   for(; c < nCols(); c++)
   {
      if(primal[c] != 0)
      {
         if(unscaled && _isScaled)
         {
            lp_scaler->getColUnscaled(*this, c, tmp);
            activity.multAdd(primal[c], tmp);
         }
         else
            activity.multAdd(primal[c], colVector(c));
      }
   }
}